

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple.cc
# Opt level: O0

void LogText::Log(string *line)

{
  LogText *pLVar1;
  ostream *poVar2;
  string *in_RDI;
  string *in_stack_ffffffffffffffa8;
  string local_28 [40];
  
  pLVar1 = capture_thread::ThreadCapture<LogText>::GetCurrent();
  if (pLVar1 == (LogText *)0x0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"*** Not captured: \"");
    poVar2 = std::operator<<(poVar2,in_RDI);
    poVar2 = std::operator<<(poVar2,"\" ***");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    pLVar1 = capture_thread::ThreadCapture<LogText>::GetCurrent();
    std::__cxx11::string::string(local_28,in_RDI);
    LogLine(pLVar1,in_stack_ffffffffffffffa8);
    std::__cxx11::string::~string(local_28);
  }
  return;
}

Assistant:

static void Log(std::string line) {
    if (GetCurrent()) {
      GetCurrent()->LogLine(std::move(line));
    } else {
      std::cerr << "*** Not captured: \"" << line << "\" ***" << std::endl;
    }
  }